

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Izhikevich.cpp
# Opt level: O1

Event * __thiscall Izhikevich::update(Izhikevich *this,double n_dt)

{
  Izhikevich_param *pIVar1;
  Event *pEVar2;
  Clock *pCVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  this->dt = n_dt;
  dVar6 = this->v;
  dVar4 = this->u;
  dVar5 = ((dVar6 * 0.04 * dVar6 + dVar6 * 5.0 + 140.0) - dVar4) + this->input_current;
  this->dv = dVar5;
  dVar7 = (this->param->b * dVar6 - dVar4) * this->param->a;
  this->du = dVar7;
  dVar6 = dVar5 * n_dt + this->input_spike + dVar6;
  this->u = dVar7 * n_dt + dVar4;
  dVar4 = -1.79769313486232e+308;
  if (-1.79769313486232e+308 <= dVar6) {
    dVar4 = dVar6;
  }
  this->v = dVar4;
  Logging::logValue((this->super_Neuron).logger,(this->super_Neuron).populationID,
                    (this->super_Neuron).neuronID,0,dVar4);
  (*(this->super_Neuron)._vptr_Neuron[2])(this);
  pIVar1 = this->param;
  if (this->v < pIVar1->v_thres || this->v == pIVar1->v_thres) {
    pEVar2 = (Event *)operator_new(0x18);
    pEVar2->type = No;
    pEVar2->_vptr_Event = (_func_int **)&PTR_setWeight_00123a58;
    pCVar3 = Clock::getInstance();
    dVar6 = Clock::getCurrentTime(pCVar3);
  }
  else {
    this->v = pIVar1->c;
    this->u = pIVar1->d + this->u;
    pEVar2 = (Event *)operator_new(0x28);
    pEVar2->_vptr_Event = (_func_int **)&PTR_setWeight_001239e0;
    *(undefined4 *)&pEVar2[1]._vptr_Event = 1;
    *(undefined8 *)&pEVar2[1].type = 0x3ff0000000000000;
    pEVar2->type = Spike;
    pCVar3 = Clock::getInstance();
    dVar6 = Clock::getCurrentTime(pCVar3);
  }
  pEVar2->eventTime = dVar6;
  return pEVar2;
}

Assistant:

Event* Izhikevich::update(double n_dt) {
    dt = n_dt;
    
    dv = 0.04*v*v + 5*v + 140 - u + input_current;
    du = param->a*(param->b*v - u);

    v += dv * dt + input_spike;
    u += du * dt;

    v = ( v < -std::numeric_limits< double >::max() ? -std::numeric_limits< double >::max() : v );

    logger->logValue(populationID, neuronID, ValueType::voltage, v);

    resetInput();

    if(v > param->v_thres) {
        v = param->c;
        u += param->d;
        return new SpikeEvent();
    }

    return new NoEvent();
}